

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

void __thiscall
cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
          (cmCompiledGeneratorExpression *this,cmListFileBacktrace *backtrace,string *input)

{
  bool bVar1;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> local_90;
  undefined1 local_78 [8];
  cmGeneratorExpressionParser p;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> tokens;
  cmGeneratorExpressionLexer local_22;
  string *psStack_20;
  cmGeneratorExpressionLexer l;
  string *input_local;
  cmListFileBacktrace *backtrace_local;
  cmCompiledGeneratorExpression *this_local;
  
  psStack_20 = input;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  ::vector(&this->Evaluators);
  std::__cxx11::string::string((string *)&this->Input,(string *)input);
  this->EvaluateForBuildsystem = false;
  this->Quiet = false;
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  set(&this->DependTargets);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->AllTargetsSeen);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SeenTargetProperties);
  std::
  map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->MaxLanguageStandard);
  std::__cxx11::string::string((string *)&this->Output);
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  this->HadLinkLanguageSensitiveCondition = false;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->SourceSensitiveTargets);
  cmGeneratorExpressionLexer::cmGeneratorExpressionLexer(&local_22);
  cmGeneratorExpressionLexer::Tokenize
            ((vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
             &p.NestingLevel,&local_22,&this->Input);
  bVar1 = cmGeneratorExpressionLexer::GetSawGeneratorExpression(&local_22);
  this->NeedsEvaluation = bVar1;
  if ((this->NeedsEvaluation & 1U) != 0) {
    std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::vector
              (&local_90,
               (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
               &p.NestingLevel);
    cmGeneratorExpressionParser::cmGeneratorExpressionParser
              ((cmGeneratorExpressionParser *)local_78,&local_90);
    std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::~vector
              (&local_90);
    cmGeneratorExpressionParser::Parse((cmGeneratorExpressionParser *)local_78,&this->Evaluators);
    cmGeneratorExpressionParser::~cmGeneratorExpressionParser
              ((cmGeneratorExpressionParser *)local_78);
  }
  std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::~vector
            ((vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *)
             &p.NestingLevel);
  return;
}

Assistant:

cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(
  cmListFileBacktrace backtrace, std::string input)
  : Backtrace(std::move(backtrace))
  , Input(std::move(input))
{
  cmGeneratorExpressionLexer l;
  std::vector<cmGeneratorExpressionToken> tokens = l.Tokenize(this->Input);
  this->NeedsEvaluation = l.GetSawGeneratorExpression();

  if (this->NeedsEvaluation) {
    cmGeneratorExpressionParser p(tokens);
    p.Parse(this->Evaluators);
  }
}